

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O3

int LowMC_test_vector_192_192_30_1(void)

{
  int iVar1;
  uint8_t ciphertext_expected [24];
  uint8_t plaintext [24];
  uint8_t key [24];
  uint8_t local_58 [32];
  uint8_t local_38 [32];
  uint8_t local_18 [24];
  
  local_18[0x10] = '\0';
  local_18[0x11] = '\0';
  local_18[0x12] = '\0';
  local_18[0x13] = '\0';
  local_18[0x14] = '\0';
  local_18[0x15] = '\0';
  local_18[0x16] = '\0';
  local_18[0x17] = '\0';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_58[0x10] = 0xbb;
  local_58[0x11] = 'd';
  local_58[0x12] = 0x9a;
  local_58[0x13] = 0xe6;
  local_58[0x14] = 0xaf;
  local_58[0x15] = 'e';
  local_58[0x16] = 0x9f;
  local_58[0x17] = 'o';
  local_18[0] = 0x80;
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  local_18[8] = '\0';
  local_18[9] = '\0';
  local_18[10] = '\0';
  local_18[0xb] = '\0';
  local_18[0xc] = '\0';
  local_18[0xd] = '\0';
  local_18[0xe] = '\0';
  local_18[0xf] = '\0';
  local_38[0] = 0xab;
  local_38[1] = 0xff;
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_58[0] = 0xa8;
  local_58[1] = '[';
  local_58[2] = 0x82;
  local_58[3] = 'D';
  local_58[4] = '4';
  local_58[5] = 'J';
  local_58[6] = '.';
  local_58[7] = '\x1b';
  local_58[8] = '\x10';
  local_58[9] = 0xa1;
  local_58[10] = '{';
  local_58[0xb] = 0xab;
  local_58[0xc] = '\x04';
  local_58[0xd] = '0';
  local_58[0xe] = 's';
  local_58[0xf] = 0xf6;
  iVar1 = lowmc_enc(&parameters_192_192_30,local_18,local_38,local_58);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_192_192_30_1(void) {
  const uint8_t key[24] = {0x80, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                           0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t plaintext[24]           = {0xAB, 0xFF, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t ciphertext_expected[24] = {0xA8, 0x5B, 0x82, 0x44, 0x34, 0x4A, 0x2E, 0x1B,
                                           0x10, 0xA1, 0x7B, 0xAB, 0x04, 0x30, 0x73, 0xF6,
                                           0xBB, 0x64, 0x9A, 0xE6, 0xAF, 0x65, 0x9F, 0x6F};

  return lowmc_enc(&parameters_192_192_30, key, plaintext, ciphertext_expected);
}